

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<QFactoryLoader_*>::end(QList<QFactoryLoader_*> *this)

{
  QFactoryLoader **n;
  QArrayDataPointer<QFactoryLoader_*> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<QFactoryLoader_*> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<QFactoryLoader_*> *)0x4549a9);
  QArrayDataPointer<QFactoryLoader_*>::operator->(in_RDI);
  n = QArrayDataPointer<QFactoryLoader_*>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }